

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_open_bound(void)

{
  uv_os_sock_t __fd;
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  uv_tcp_t server;
  
  __fd = create_tcp_socket();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = bind(__fd,(sockaddr *)&addr,0x10);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_open(&server,__fd);
        if (iVar1 == 0) {
          iVar1 = uv_listen(&server,0x80,0);
          if (iVar1 == 0) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0x149;
          }
          else {
            pcVar3 = "0 == uv_listen((uv_stream_t*) &server, 128, NULL)";
            uVar2 = 0x147;
          }
        }
        else {
          pcVar3 = "0 == uv_tcp_open(&server, sock)";
          uVar2 = 0x145;
        }
      }
      else {
        pcVar3 = "0 == bind(sock, (struct sockaddr*) &addr, sizeof(addr))";
        uVar2 = 0x143;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(uv_default_loop(), &server)";
      uVar2 = 0x141;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0x13f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_open_bound) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_os_sock_t sock;

  startup();
  sock = create_tcp_socket();

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &server));

  ASSERT(0 == bind(sock, (struct sockaddr*) &addr, sizeof(addr)));

  ASSERT(0 == uv_tcp_open(&server, sock));

  ASSERT(0 == uv_listen((uv_stream_t*) &server, 128, NULL));

  MAKE_VALGRIND_HAPPY();
  return 0;
}